

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIOBuildFmsMetaData(FmsMetaData md,FmsIOMetaDataInfo *minfo)

{
  FmsIntType FVar1;
  int iVar2;
  FmsMetaDataType FVar3;
  undefined8 in_RAX;
  void *pvVar4;
  size_t *psVar5;
  FmsIOMetaDataInfo *minfo_00;
  ulong uVar6;
  void *data;
  FmsMetaData *local_20;
  
  if (minfo == (FmsIOMetaDataInfo *)0x0 || md == (FmsMetaData)0x0) {
    return (int)CONCAT71((int7)((ulong)in_RAX >> 8),md == (FmsMetaData)0x0);
  }
  FVar3 = minfo->mdtype;
  switch(FVar3) {
  case FMS_INTEGER:
    local_20 = (FmsMetaData *)0x0;
    iVar2 = FmsMetaDataSetIntegers(md,minfo->name,(minfo->subtype).i_type,minfo->size,&local_20);
    if (local_20 == (FmsMetaData *)0x0) {
      return iVar2;
    }
    pvVar4 = minfo->data;
    FVar1 = (minfo->subtype).i_type;
    psVar5 = FmsIntTypeSize;
    break;
  case FMS_SCALAR:
    local_20 = (FmsMetaData *)0x0;
    iVar2 = FmsMetaDataSetScalars(md,minfo->name,(minfo->subtype).s_type,minfo->size,&local_20);
    if (local_20 == (FmsMetaData *)0x0) {
      return iVar2;
    }
    pvVar4 = minfo->data;
    FVar1 = (minfo->subtype).i_type;
    psVar5 = FmsScalarTypeSize;
    break;
  case FMS_STRING:
    iVar2 = FmsMetaDataSetString(md,minfo->name,(char *)minfo->data);
    return iVar2;
  case FMS_META_DATA:
    local_20 = (FmsMetaData *)0x0;
    minfo_00 = (FmsIOMetaDataInfo *)minfo->data;
    FVar3 = FmsMetaDataSetMetaData(md,minfo->name,minfo->size,&local_20);
    if (local_20 != (FmsMetaData *)0x0) {
      for (uVar6 = 0; uVar6 < minfo->size; uVar6 = uVar6 + 1) {
        FVar3 = FmsIOBuildFmsMetaData(local_20[uVar6],minfo_00);
        minfo_00 = minfo_00 + 1;
      }
    }
  default:
    goto LAB_00110122;
  }
  pvVar4 = memcpy(local_20,pvVar4,minfo->size * psVar5[FVar1]);
  FVar3 = (FmsMetaDataType)pvVar4;
LAB_00110122:
  return FVar3;
}

Assistant:

static int
FmsIOBuildFmsMetaData(FmsMetaData md, FmsIOMetaDataInfo *minfo) {
  if(!md) E_RETURN(1);
  if(!minfo) E_RETURN(2);
  switch(minfo->mdtype) {
  case FMS_INTEGER: {
    void *data = NULL;
    FmsMetaDataSetIntegers(md, minfo->name, minfo->subtype.i_type, minfo->size,
                           &data);
    if(data)
      memcpy(data, minfo->data,
             FmsIntTypeSize[minfo->subtype.i_type]*minfo->size);
    else
      E_RETURN(3);
    break;
  }
  case FMS_SCALAR: {
    void *data = NULL;
    FmsMetaDataSetScalars(md, minfo->name, minfo->subtype.s_type, minfo->size,
                          &data);
    if(data)
      memcpy(data, minfo->data,
             FmsScalarTypeSize[minfo->subtype.s_type]*minfo->size);
    else
      E_RETURN(4);
    break;
  }
  case FMS_STRING:
    FmsMetaDataSetString(md, minfo->name, (const char*)minfo->data);
    break;
  case FMS_META_DATA: {
    /* New scope */
    FmsInt i;
    FmsMetaData *child = NULL;
    FmsIOMetaDataInfo *mds = (FmsIOMetaDataInfo*)minfo->data;
    FmsMetaDataSetMetaData(md, minfo->name, minfo->size, &child);
    if(child) {
      for(i = 0; i < minfo->size; ++i)
        FmsIOBuildFmsMetaData(child[i], &mds[i]);
    } else
      E_RETURN(5);
  }
  break;
  default:
    // Corrupt mdtype
    E_RETURN(6);
    break;
  }
  return 0;
}